

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read669.c
# Opt level: O0

int it_669_read_sample_header(IT_SAMPLE *sample,DUMBFILE *f)

{
  int32 iVar1;
  int iVar2;
  DUMBFILE *in_RSI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  dumbfile_getnc((char *)sample,f._4_4_,
                 (DUMBFILE *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  *(undefined1 *)(in_RDI + 0xd) = 0;
  *(undefined1 *)(in_RDI + 0x23) = 0;
  iVar1 = dumbfile_igetl(in_RSI);
  *(int32 *)(in_RDI + 0x38) = iVar1;
  iVar1 = dumbfile_igetl(in_RSI);
  *(int32 *)(in_RDI + 0x3c) = iVar1;
  iVar1 = dumbfile_igetl(in_RSI);
  *(int32 *)(in_RDI + 0x40) = iVar1;
  iVar2 = dumbfile_error(in_RSI);
  if (iVar2 == 0) {
    if (*(int *)(in_RDI + 0x38) < 1) {
      *(undefined1 *)(in_RDI + 0x32) = 0;
      iVar2 = 0;
    }
    else {
      *(undefined1 *)(in_RDI + 0x32) = 1;
      *(undefined1 *)(in_RDI + 0x33) = 0x40;
      *(undefined1 *)(in_RDI + 0x34) = 0x40;
      *(undefined1 *)(in_RDI + 0x35) = 0;
      *(undefined4 *)(in_RDI + 0x44) = 0x20ab;
      if ((*(int *)(in_RDI + 0x38) < *(int *)(in_RDI + 0x40)) && (*(int *)(in_RDI + 0x3c) == 0)) {
        *(undefined4 *)(in_RDI + 0x40) = 0;
      }
      if (*(int *)(in_RDI + 0x38) < *(int *)(in_RDI + 0x40)) {
        *(undefined4 *)(in_RDI + 0x40) = *(undefined4 *)(in_RDI + 0x38);
      }
      if (2 < *(int *)(in_RDI + 0x40) - *(int *)(in_RDI + 0x3c)) {
        *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) | 0x10;
      }
      *(undefined1 *)(in_RDI + 0x50) = 0;
      *(undefined1 *)(in_RDI + 0x51) = 0;
      *(undefined1 *)(in_RDI + 0x52) = 0;
      *(undefined1 *)(in_RDI + 0x53) = 0;
      *(undefined2 *)(in_RDI + 0x54) = 0;
      *(undefined4 *)(in_RDI + 0x60) = 0xffffffff;
      iVar2 = 0;
    }
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int it_669_read_sample_header(IT_SAMPLE *sample, DUMBFILE *f)
{
    dumbfile_getnc((char *)sample->name, 13, f);
	sample->name[13] = 0;

	sample->filename[0] = 0;

	sample->length = dumbfile_igetl(f);
	sample->loop_start = dumbfile_igetl(f);
	sample->loop_end = dumbfile_igetl(f);

	if (dumbfile_error(f))
		return -1;

	if (sample->length <= 0) {
		sample->flags = 0;
		return 0;
	}

	sample->flags = IT_SAMPLE_EXISTS;

	sample->global_volume = 64;
	sample->default_volume = 64;

	sample->default_pan = 0;
	sample->C5_speed = 8363;
	// the above line might be wrong

	if ((sample->loop_end > sample->length) && !(sample->loop_start))
		sample->loop_end = 0;

	if (sample->loop_end > sample->length)
		sample->loop_end = sample->length;

	if (sample->loop_end - sample->loop_start > 2)
		sample->flags |= IT_SAMPLE_LOOP;

	sample->vibrato_speed = 0;
	sample->vibrato_depth = 0;
	sample->vibrato_rate = 0;
	sample->vibrato_waveform = 0; // do we have to set _all_ these?
	sample->finetune = 0;
	sample->max_resampling_quality = -1;

	return 0;
}